

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespaces.h
# Opt level: O0

void __thiscall neural_networks::utilities::Matrix<long_double>::print(Matrix<long_double> *this)

{
  const_reference this_00;
  const_reference pvVar1;
  ostream *poVar2;
  ulong local_20;
  size_t j;
  size_t i;
  Matrix<long_double> *this_local;
  
  std::operator<<((ostream *)&std::cout,"\n");
  for (j = 0; j < this->N; j = j + 1) {
    std::operator<<((ostream *)&std::cout,"[ ");
    for (local_20 = 0; local_20 < this->M; local_20 = local_20 + 1) {
      this_00 = std::
                vector<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                ::operator[](&this->matrix,j);
      pvVar1 = std::vector<long_double,_std::allocator<long_double>_>::operator[](this_00,local_20);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(longdouble *)pvVar1);
      std::operator<<(poVar2," ");
    }
    std::operator<<((ostream *)&std::cout,"]\n");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void neural_networks::utilities::Matrix<T>::print() const {
    std::cout << "\n";
    size_t i, j;
    for(i = 0; i < N; ++i) {
        std::cout << "[ ";
        for(j = 0; j < M; ++j) {
            std::cout << matrix[i][j] << " ";
        }
        std::cout << "]\n";
    }
    std::cout << std::endl;
}